

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

void __thiscall
QTextDocumentLayoutPrivate::drawTableCellBorder
          (QTextDocumentLayoutPrivate *this,QRectF *cellRect,QPainter *painter,QTextTable *table,
          QTextTableData *td,QTextTableCell *cell)

{
  int iVar1;
  long lVar2;
  QTextDocument *pQVar3;
  bool ignoreEdgesAbove;
  int iVar4;
  int iVar5;
  int iVar6;
  RenderHints RVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  long lVar17;
  qreal *pqVar18;
  bool bVar19;
  BorderPaginator *pBVar20;
  byte bVar21;
  bool bVar22;
  long in_FS_OFFSET;
  bool bVar23;
  double dVar24;
  double dVar25;
  QSizeF QVar26;
  double local_150;
  QRectF local_e8;
  QTextTableCell local_c0;
  QTextTableCell local_b0;
  QRectF local_a0;
  BorderPaginator paginator;
  
  bVar21 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (td->super_QTextFrameData).border.val + (td->cellSpacing).val;
  local_150 = (double)((td->super_QTextFrameData).effectiveTopMargin.val + iVar4) * 0.015625;
  iVar1 = (td->super_QTextFrameData).effectiveBottomMargin.val;
  QTextTable::format((QTextTable *)&paginator);
  iVar5 = QTextFormat::intProperty((QTextFormat *)&paginator,0x4104);
  iVar6 = QTextTable::rows(table);
  iVar8 = iVar6 + -1;
  if (iVar5 < iVar6 + -1) {
    iVar8 = iVar5;
  }
  QTextFormat::~QTextFormat((QTextFormat *)&paginator);
  if ((0 < iVar8) && (iVar5 = QTextTableCell::row(cell), iVar8 <= iVar5)) {
    local_150 = local_150 + (double)(td->headerHeight).val * 0.015625;
  }
  pqVar18 = (qreal *)&DAT_006bc718;
  pBVar20 = &paginator;
  for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
    pBVar20->pageHeight = *pqVar18;
    pqVar18 = pqVar18 + (ulong)bVar21 * -2 + 1;
    pBVar20 = (BorderPaginator *)((long)pBVar20 + (ulong)bVar21 * -0x10 + 8);
  }
  QVar26 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
  paginator.pageHeight = QVar26.ht;
  paginator.bottomPage = 0;
  paginator.topPage = (int)(cellRect->yp / paginator.pageHeight);
  if (paginator.pageHeight <= 0.0) {
    paginator.topPage = 0;
  }
  else {
    paginator.bottomPage = (int)((cellRect->yp + cellRect->h + 0.0) / paginator.pageHeight);
  }
  paginator.rect.xp = cellRect->xp;
  paginator.rect.yp = cellRect->yp;
  paginator.rect.w = cellRect->w;
  paginator.rect.h = cellRect->h;
  paginator.topMarginAfterPageBreak = local_150;
  paginator.border = 0.0;
  paginator.bottomMargin = (double)(iVar4 + iVar1) * 0.015625;
  RVar7 = QPainter::renderHints(painter);
  QPainter::setRenderHint(painter,Antialiasing,true);
  iVar1 = paginator.topPage;
  if (paginator.topPage <= paginator.bottomPage) {
    do {
      local_e8.w._0_4_ = 0xffffffff;
      local_e8.w._4_4_ = 0xffffffff;
      local_e8.h._0_4_ = 0xffffffff;
      local_e8.h._4_4_ = 0xffffffff;
      local_e8.xp._0_4_ = 0xffffffff;
      local_e8.xp._4_4_ = 0xffffffff;
      local_e8.yp._0_4_ = 0xffffffff;
      local_e8.yp._4_4_ = 0xffffffff;
      BorderPaginator::clipRect(&local_e8,&paginator,iVar1);
      if ((0.0 < (double)CONCAT44(local_e8.w._4_4_,local_e8.w._0_4_)) &&
         (0.0 < (double)CONCAT44(local_e8.h._4_4_,local_e8.h._0_4_))) {
        dVar24 = cellRect->yp;
        iVar8 = QTextTableCell::row(cell);
        dVar24 = (double)(td->rowPositions).d.ptr[iVar8].val * -0.015625 + dVar24;
        QTextTable::format((QTextTable *)&local_a0);
        iVar8 = QTextFormat::intProperty((QTextFormat *)&local_a0,0x4104);
        QTextFormat::~QTextFormat((QTextFormat *)&local_a0);
        QTextTable::format((QTextTable *)&local_a0);
        iVar4 = QTextFormat::intProperty((QTextFormat *)&local_a0,0x4104);
        QTextFormat::~QTextFormat((QTextFormat *)&local_a0);
        iVar5 = QTextTableCell::row(cell);
        QTextTable::format((QTextTable *)&local_a0);
        iVar6 = QTextFormat::intProperty((QTextFormat *)&local_a0,0x4104);
        QTextFormat::~QTextFormat((QTextFormat *)&local_a0);
        iVar9 = QTextTableCell::row(cell);
        iVar10 = QTextTableCell::row(cell);
        iVar11 = QTextTableCell::rowSpan(cell);
        iVar12 = QTextTable::rows(table);
        if (iVar9 == iVar8 || iVar5 < iVar6) {
          bVar19 = false;
        }
        else {
          pQVar3 = (this->super_QAbstractTextDocumentLayoutPrivate).document;
          iVar9 = QTextTableCell::column(cell);
          iVar13 = QTextTableCell::row(cell);
          if (((iVar13 < 1 || iVar9 < 0) || (iVar14 = QTextTable::columns(table), iVar14 <= iVar9))
             || (iVar9 = QTextTable::rows(table), iVar9 < iVar13)) {
            local_b0.table = (QTextTable *)0x0;
          }
          else {
            iVar9 = QTextTableCell::row(cell);
            QTextTableCell::column(cell);
            QTextTable::cellAt((QTextTable *)&local_b0,(int)table,iVar9 + -1);
          }
          QTextTableData::cellRect(&local_a0,td,&local_b0);
          dVar25 = local_a0.yp + dVar24 + local_a0.h;
          QVar26 = QTextDocument::pageSize(pQVar3);
          iVar9 = (int)((dVar25 + 0.0) / QVar26.ht);
          if (QVar26.ht <= 0.0) {
            iVar9 = 0;
          }
          bVar19 = iVar9 < iVar1;
        }
        if (iVar11 + iVar10 < iVar12) {
          pQVar3 = (this->super_QAbstractTextDocumentLayoutPrivate).document;
          iVar9 = QTextTableCell::rowSpan(cell);
          uVar15 = QTextTableCell::column(cell);
          iVar10 = QTextTableCell::row(cell);
          if ((((int)(uVar15 | iVar10 + iVar9) < 0) ||
              (iVar11 = QTextTable::columns(table), iVar11 <= (int)uVar15)) ||
             (iVar11 = QTextTable::rows(table), iVar11 <= iVar10 + iVar9)) {
            local_c0.table = (QTextTable *)0x0;
          }
          else {
            iVar10 = QTextTableCell::row(cell);
            QTextTableCell::column(cell);
            QTextTable::cellAt((QTextTable *)&local_c0,(int)table,iVar9 + iVar10);
          }
          QTextTableData::cellRect(&local_a0,td,&local_c0);
          dVar24 = dVar24 + local_a0.yp;
          QVar26 = QTextDocument::pageSize(pQVar3);
          iVar9 = (int)(dVar24 / QVar26.ht);
          if (QVar26.ht <= 0.0) {
            iVar9 = 0;
          }
          bVar16 = iVar1 < iVar9;
        }
        else {
          bVar16 = false;
        }
        bVar22 = iVar1 != paginator.topPage;
        bVar23 = iVar1 != paginator.bottomPage;
        bVar21 = iVar1 == paginator.topPage & bVar19;
        bVar19 = td->borderCollapse;
        if (bVar19 == true) {
          bVar22 = (bool)((0 < iVar4 & bVar21 | iVar1 != paginator.topPage) & iVar6 <= iVar5);
        }
        if (bVar19 != false) {
          bVar23 = (bool)((iVar1 != paginator.bottomPage | bVar16) & iVar6 <= iVar5);
        }
        ignoreEdgesAbove = (bool)(iVar4 < 1 & bVar21);
        bVar16 = iVar4 < 1 && iVar1 != paginator.topPage;
        if (bVar19 == false) {
          bVar16 = iVar1 != paginator.topPage;
        }
        if (bVar22 == false) {
          drawCellBorder(this,painter,table,td,cell,&local_e8,TopEdge,-1,true,true,ignoreEdgesAbove)
          ;
          iVar8 = -1;
        }
        else {
          iVar8 = iVar8 + -1;
        }
        drawCellBorder(this,painter,table,td,cell,&local_e8,LeftEdge,iVar8,(bool)(bVar16 ^ 1U),
                       (bool)(bVar23 ^ 1U),ignoreEdgesAbove);
        drawCellBorder(this,painter,table,td,cell,&local_e8,RightEdge,iVar8,(bool)(bVar16 ^ 1U),
                       (bool)(bVar23 ^ 1U),ignoreEdgesAbove);
        if (bVar23 == false) {
          drawCellBorder(this,painter,table,td,cell,&local_e8,BottomEdge,-1,true,true,false);
        }
      }
      bVar19 = iVar1 < paginator.bottomPage;
      iVar1 = iVar1 + 1;
    } while (bVar19);
  }
  if (((uint)RVar7.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
             super_QFlagsStorage<QPainter::RenderHint>.i & 1) == 0) {
    QPainter::setRenderHint(painter,Antialiasing,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawTableCellBorder(const QRectF &cellRect, QPainter *painter,
                                                     QTextTable *table, QTextTableData *td,
                                                     const QTextTableCell &cell) const
{
#ifndef QT_NO_CSSPARSER
    qreal topMarginAfterPageBreak = (td->effectiveTopMargin + td->cellSpacing + td->border).toReal();
    qreal bottomMargin = (td->effectiveBottomMargin + td->cellSpacing + td->border).toReal();

    const int headerRowCount = qMin(table->format().headerRowCount(), table->rows() - 1);
    if (headerRowCount > 0 && cell.row() >= headerRowCount)
        topMarginAfterPageBreak += td->headerHeight.toReal();

    BorderPaginator paginator(document, cellRect, topMarginAfterPageBreak, bottomMargin, 0);

    bool turn_off_antialiasing = !(painter->renderHints() & QPainter::Antialiasing);
    painter->setRenderHint(QPainter::Antialiasing);

    // paint cell borders for every page the cell appears on
    for (int page = paginator.topPage; page <= paginator.bottomPage; ++page) {
        const QRectF clipped = paginator.clipRect(page);
        if (!clipped.isValid())
            continue;

        const qreal offset = cellRect.top() - td->rowPositions.at(cell.row()).toReal();
        const int lastHeaderRow = table->format().headerRowCount() - 1;
        const bool tableHasHeader = table->format().headerRowCount() > 0;
        const bool isHeaderRow = cell.row() < table->format().headerRowCount();
        const bool isFirstRow = cell.row() == lastHeaderRow + 1;
        const bool isLastRow = cell.row() + cell.rowSpan() >= table->rows();
        const bool previousRowOnPreviousPage = !isFirstRow
                && !isHeaderRow
                && BorderPaginator(document,
                                   td->cellRect(adjacentCell(table, cell, QCss::TopEdge)).translated(0, offset),
                                   topMarginAfterPageBreak,
                                   bottomMargin,
                                   0).bottomPage < page;
        const bool nextRowOnNextPage = !isLastRow
                && BorderPaginator(document,
                                   td->cellRect(adjacentCell(table, cell, QCss::BottomEdge)).translated(0, offset),
                                   topMarginAfterPageBreak,
                                   bottomMargin,
                                   0).topPage > page;
        const bool rowStartsOnPage = page == paginator.topPage;
        const bool rowEndsOnPage = page == paginator.bottomPage;
        const bool rowStartsOnPageTop = !tableHasHeader
                && rowStartsOnPage
                && previousRowOnPreviousPage;
        const bool rowStartsOnPageBelowHeader = tableHasHeader
                && rowStartsOnPage
                && previousRowOnPreviousPage;

        const bool suppressTopBorder = td->borderCollapse
                ? !isHeaderRow && (!rowStartsOnPage || rowStartsOnPageBelowHeader)
                : !rowStartsOnPage;
        const bool suppressBottomBorder = td->borderCollapse
                ? !isHeaderRow && (!rowEndsOnPage || nextRowOnNextPage)
                : !rowEndsOnPage;
        const bool doNotAdjustTopAnchor = td->borderCollapse
                ? !tableHasHeader && !rowStartsOnPage
                : !rowStartsOnPage;
        const bool doNotAdjustBottomAnchor = suppressBottomBorder;

        if (!suppressTopBorder) {
            drawCellBorder(this, painter, table, td, cell, clipped, QCss::TopEdge,
                           -1, true, true, rowStartsOnPageTop);
        }

        drawCellBorder(this, painter, table, td, cell, clipped, QCss::LeftEdge,
                       suppressTopBorder ? lastHeaderRow : -1,
                       !doNotAdjustTopAnchor,
                       !doNotAdjustBottomAnchor,
                       rowStartsOnPageTop);
        drawCellBorder(this, painter, table, td, cell, clipped, QCss::RightEdge,
                       suppressTopBorder ? lastHeaderRow : -1,
                       !doNotAdjustTopAnchor,
                       !doNotAdjustBottomAnchor,
                       rowStartsOnPageTop);

        if (!suppressBottomBorder) {
            drawCellBorder(this, painter, table, td, cell, clipped, QCss::BottomEdge,
                           -1, true, true, false);
        }
    }

    if (turn_off_antialiasing)
        painter->setRenderHint(QPainter::Antialiasing, false);
#else
    Q_UNUSED(cell);
    Q_UNUSED(cellRect);
    Q_UNUSED(painter);
    Q_UNUSED(table);
    Q_UNUSED(td);
    Q_UNUSED(cell);
#endif
}